

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  array<vec<3UL,_int>,_3UL> pts;
  vec3f v;
  pointer image_00;
  size_t sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  uint8_t R;
  TGAColor color;
  double dVar5;
  vec3i vVar6;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  TGAColor local_19d;
  undefined8 local_198;
  undefined1 auStack_190 [12];
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  double local_168;
  double intensity;
  vec<3UL,_double> local_148;
  undefined1 local_130 [8];
  vec3f n;
  double local_110;
  double local_108;
  vec3f local_f0;
  value_type local_d8;
  int local_cc;
  undefined1 local_c8 [4];
  int j;
  array<vec<3UL,_double>,_3UL> world_coords;
  array<vec<3UL,_int>,_3UL> screen_coords;
  size_t i;
  allocator<double> local_39;
  value_type_conflict local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> zbuffer;
  TGAImage *image_local;
  Model *model_local;
  
  zbuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)image;
  dVar5 = std::numeric_limits<double>::max();
  local_38 = (value_type_conflict)((ulong)dVar5 ^ (ulong)DAT_0010e060);
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,360000,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  screen_coords._M_elems[2].y = 0;
  screen_coords._M_elems[2].z = 0;
  while( true ) {
    sVar1 = Model::nfaces(model);
    if (sVar1 <= (ulong)screen_coords._M_elems[2]._4_8_) break;
    std::array<vec<3UL,_int>,_3UL>::array
              ((array<vec<3UL,_int>,_3UL> *)((long)&world_coords._M_elems[2].z + 4));
    std::array<vec<3UL,_double>,_3UL>::array((array<vec<3UL,_double>,_3UL> *)local_c8);
    for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
      Model::vert(&local_f0,model,screen_coords._M_elems[2]._4_8_,(long)local_cc);
      v.y._0_4_ = SUB84(local_f0.z,0);
      v.x = local_f0.y;
      v.y._4_4_ = (int)((ulong)local_f0.z >> 0x20);
      v.z._0_4_ = in_stack_fffffffffffffde0;
      v.z._4_4_ = in_stack_fffffffffffffde4;
      vVar6 = world2screen(v);
      local_d8 = vVar6;
      pvVar2 = std::array<vec<3UL,_int>,_3UL>::operator[]
                         ((array<vec<3UL,_int>,_3UL> *)((long)&world_coords._M_elems[2].z + 4),
                          (long)local_cc);
      *pvVar2 = local_d8;
      Model::vert((vec3f *)&n.z,model,screen_coords._M_elems[2]._4_8_,(long)local_cc);
      pvVar3 = std::array<vec<3UL,_double>,_3UL>::operator[]
                         ((array<vec<3UL,_double>,_3UL> *)local_c8,(long)local_cc);
      pvVar3->x = n.z;
      pvVar3->y = local_110;
      pvVar3->z = local_108;
    }
    pvVar3 = std::array<vec<3UL,_double>,_3UL>::operator[]
                       ((array<vec<3UL,_double>,_3UL> *)local_c8,2);
    pvVar4 = std::array<vec<3UL,_double>,_3UL>::operator[]
                       ((array<vec<3UL,_double>,_3UL> *)local_c8,0);
    operator-(&local_148,pvVar3,pvVar4);
    pvVar3 = std::array<vec<3UL,_double>,_3UL>::operator[]
                       ((array<vec<3UL,_double>,_3UL> *)local_c8,1);
    pvVar4 = std::array<vec<3UL,_double>,_3UL>::operator[]
                       ((array<vec<3UL,_double>,_3UL> *)local_c8,0);
    operator-((vec<3UL,_double> *)&intensity,pvVar3,pvVar4);
    cross((vec3f *)local_130,&local_148,(vec3f *)&intensity);
    vec<3UL,_double>::normalize((vec<3UL,_double> *)local_130);
    local_168 = dot<3ul,double>((vec<3UL,_double> *)local_130,&light_dir);
    image_00 = zbuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    iStack_180 = in_stack_fffffffffffffde0;
    iStack_17c = in_stack_fffffffffffffde4;
    if (0.0 < local_168) {
      local_178 = screen_coords._M_elems[2].x;
      stack0xfffffffffffffe78 = screen_coords._M_elems._8_8_;
      _iStack_180 = screen_coords._M_elems[1]._4_8_;
      local_198 = stack0xffffffffffffff84;
      auStack_190._0_8_ = screen_coords._M_elems[0]._0_8_;
      R = (uint8_t)(int)(local_168 * 255.0);
      TGAColor::TGAColor(&local_19d,R,R,R,0xff);
      color.bytespp = local_19d.bytespp;
      color.bgra[0] = local_19d.bgra[0];
      color.bgra[1] = local_19d.bgra[1];
      color.bgra[2] = local_19d.bgra[2];
      color.bgra[3] = local_19d.bgra[3];
      pts._M_elems[0].z = auStack_190._0_4_;
      pts._M_elems[1].x = auStack_190._4_4_;
      pts._M_elems[0].x = (undefined4)local_198;
      pts._M_elems[0].y = local_198._4_4_;
      pts._M_elems[1].y = auStack_190._8_4_;
      pts._M_elems[1].z = iStack_184;
      pts._M_elems[2].x = iStack_180;
      pts._M_elems[2].y = iStack_17c;
      pts._M_elems[2].z = local_178;
      triangle(pts,(vector<double,_std::allocator<double>_> *)local_30,(TGAImage *)image_00,color);
    }
    screen_coords._M_elems[2]._4_8_ = screen_coords._M_elems[2]._4_8_ + 1;
    in_stack_fffffffffffffde0 = iStack_180;
    in_stack_fffffffffffffde4 = iStack_17c;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, zbuffer, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}